

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_remove_protocol(oonf_rfc5444_protocol *protocol)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_rfc5444_interface *i_it;
  oonf_rfc5444_interface *interf;
  oonf_rfc5444_protocol *protocol_local;
  
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(2,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x1e7,0,0,
             "Remove protocol %s (refcount was %d)",protocol,protocol->_refcount);
  }
  if (protocol->_refcount < 2) {
    plVar1 = (protocol->_interface_tree).list_head.next;
    i_it = (oonf_rfc5444_interface *)&plVar1[-2].prev;
    plVar1 = plVar1->next;
    while( true ) {
      __tempptr = (list_entity *)&plVar1[-2].prev;
      if ((i_it->_node).list.prev == (protocol->_interface_tree).list_head.prev) break;
      oonf_rfc5444_remove_interface(i_it,(oonf_rfc5444_interface_listener *)0x0);
      i_it = (oonf_rfc5444_interface *)__tempptr;
      plVar1 = plVar1->next;
    }
    oonf_duplicate_set_remove(&protocol->forwarded_set);
    oonf_duplicate_set_remove(&protocol->processed_set);
    rfc5444_reader_cleanup(&protocol->reader);
    rfc5444_writer_cleanup(&protocol->writer);
    avl_remove(&_protocol_tree,&protocol->_node);
    oonf_class_free(&_protocol_memcookie,protocol);
  }
  else {
    protocol->_refcount = protocol->_refcount + -1;
  }
  return;
}

Assistant:

void
oonf_rfc5444_remove_protocol(struct oonf_rfc5444_protocol *protocol) {
  struct oonf_rfc5444_interface *interf, *i_it;

  OONF_INFO(LOG_RFC5444, "Remove protocol %s (refcount was %d)", protocol->name, protocol->_refcount);

  if (protocol->_refcount > 1) {
    /* There are still users left for this protocol */
    protocol->_refcount--;
    return;
  }

  /* free all remaining interfaces */
  avl_for_each_element_safe(&protocol->_interface_tree, interf, _node, i_it) {
    oonf_rfc5444_remove_interface(interf, NULL);
  }

  /* free processing/forwarding set */
  oonf_duplicate_set_remove(&protocol->forwarded_set);
  oonf_duplicate_set_remove(&protocol->processed_set);

  /* free reader, writer and protocol itself */
  rfc5444_reader_cleanup(&protocol->reader);
  rfc5444_writer_cleanup(&protocol->writer);

  avl_remove(&_protocol_tree, &protocol->_node);
  oonf_class_free(&_protocol_memcookie, protocol);
}